

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O0

rt_function_error_t exec_sign_generic(rt_function_t *f)

{
  void *pvVar1;
  rt_variable_t *variable;
  rt_variable_t *variable_00;
  int iVar2;
  rt_variable_getter p_Var3;
  rt_variable_setter p_Var4;
  float fVar5;
  rt_list_t shape;
  float local_50;
  float local_4c;
  float y;
  float x;
  int i;
  int output_size;
  rt_variable_setter set_output;
  rt_variable_t *output;
  rt_variable_getter get_input;
  rt_variable_t *input;
  sign_local_context_t *c;
  rt_function_t *f_local;
  
  pvVar1 = f->local_context;
  variable = *f->inputs;
  p_Var3 = select_getter(variable);
  variable_00 = *f->outputs;
  p_Var4 = select_setter(variable_00);
  shape._4_4_ = 0;
  shape.size = ((*f->inputs)->shape).size;
  shape.data = ((*f->inputs)->shape).data;
  iVar2 = calc_shape_size(shape);
  for (y = 0.0; (int)y < iVar2; y = (float)((int)y + 1)) {
    fVar5 = (*p_Var3)(variable,(nn_size_t)y);
    if (fVar5 <= 0.0) {
      if (0.0 <= fVar5) {
        local_50 = *(float *)((long)pvVar1 + 8);
      }
      else {
        local_50 = -1.0;
      }
      local_4c = local_50;
    }
    else {
      local_4c = 1.0;
    }
    (*p_Var4)(variable_00,(nn_size_t)y,local_4c);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_sign_generic(rt_function_t *f) {
  sign_local_context_t *c = (sign_local_context_t *)(f->local_context);
  rt_variable_t *input = f->inputs[0];
  rt_variable_getter get_input = select_getter(input);
  rt_variable_t *output = f->outputs[0];
  rt_variable_setter set_output = select_setter(output);

  const int output_size = calc_shape_size(f->inputs[0]->shape);
  int i;
  for (i = 0; i < output_size; ++i) {
    float x = get_input(input, i);
    float y = (x > 0) ? 1 : ((x < 0) ? -1 : c->alpha);
    set_output(output, i, y);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}